

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmpnam.c
# Opt level: O0

char * tmpnam(char *__s)

{
  FILE *__stream;
  FILE *file;
  char *s_local;
  
  __stream = tmpfile();
  file = (FILE *)__s;
  if (__s == (char *)0x0) {
    file = (FILE *)tmpnam::filename;
  }
  strcpy((char *)file,*(char **)&__stream->_fileno);
  fclose(__stream);
  return (char *)file;
}

Assistant:

char * tmpnam( char * s )
{
    static char filename[ L_tmpnam ];
    FILE * file = tmpfile();

    if ( s == NULL )
    {
        s = filename;
    }

    strcpy( s, file->filename );
    fclose( file );
    return s;
}